

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void print_stats_diff(device_stats *stats_new,device_stats *stats_old,uint64_t nanos)

{
  undefined4 uVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM4 [16];
  
  pcVar2 = "???";
  pcVar3 = "???";
  if (stats_new->device != (ixy_device *)0x0) {
    pcVar3 = stats_new->device->pci_addr;
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = stats_new->rx_bytes - stats_old->rx_bytes;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = nanos;
  auVar4 = vpunpcklqdq_avx(auVar4,auVar5);
  auVar4 = vcvtuqq2pd_avx512vl(auVar4);
  auVar4 = vdivpd_avx(auVar4,_DAT_001086d0);
  auVar5 = vshufpd_avx(auVar4,auVar4,1);
  dVar8 = auVar5._0_8_;
  auVar6._0_8_ = auVar4._0_8_ / dVar8;
  auVar6._8_8_ = auVar4._8_8_;
  auVar4 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,stats_new->rx_pkts - stats_old->rx_pkts);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = ((auVar4._0_8_ / 1000000.0) / dVar8) * 20.0 * 8.0;
  auVar4 = vfmadd231sd_fma(auVar9,ZEXT816(0x4020000000000000),auVar6);
  uVar1 = vcvttsd2usi_avx512f(auVar4);
  printf("[%s] RX: %d Mbit/s %.2f Mpps\n",pcVar3,uVar1);
  if (stats_new->device != (ixy_device *)0x0) {
    pcVar2 = stats_new->device->pci_addr;
  }
  auVar4 = vcvtusi2sd_avx512f(in_XMM4,stats_new->tx_bytes - stats_old->tx_bytes);
  auVar10._0_8_ = (auVar4._0_8_ / 1000000.0) / dVar8;
  auVar10._8_8_ = auVar4._8_8_;
  auVar4 = vcvtusi2sd_avx512f(in_XMM4,stats_new->tx_pkts - stats_old->tx_pkts);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = ((auVar4._0_8_ / 1000000.0) / dVar8) * 20.0 * 8.0;
  auVar4 = vfmadd231sd_fma(auVar7,ZEXT816(0x4020000000000000),auVar10);
  uVar1 = vcvttsd2usi_avx512f(auVar4);
  printf("[%s] TX: %d Mbit/s %.2f Mpps\n",pcVar2,uVar1);
  return;
}

Assistant:

void print_stats_diff(struct device_stats* stats_new, struct device_stats* stats_old, uint64_t nanos) {
	printf("[%s] RX: %d Mbit/s %.2f Mpps\n", stats_new->device ? stats_new->device->pci_addr : "???",
		diff_mbit(stats_new->rx_bytes, stats_old->rx_bytes, stats_new->rx_pkts, stats_old->rx_pkts, nanos),
		diff_mpps(stats_new->rx_pkts, stats_old->rx_pkts, nanos)
	);
	printf("[%s] TX: %d Mbit/s %.2f Mpps\n", stats_new->device ? stats_new->device->pci_addr : "???",
		diff_mbit(stats_new->tx_bytes, stats_old->tx_bytes, stats_new->tx_pkts, stats_old->tx_pkts, nanos),
		diff_mpps(stats_new->tx_pkts, stats_old->tx_pkts, nanos)
	);
}